

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O2

void Mvc_CoverPrint(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pCube;
  long lVar1;
  
  pCube = (Mvc_Cube_t *)&pCover->lCubes;
  printf("The cover contains %d cubes (%d bits and %d words)\n",(ulong)(uint)(pCover->lCubes).nItems
         ,(ulong)(uint)pCover->nBits,(ulong)(uint)pCover->nWords);
  while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
    Mvc_CubePrint(pCover,pCube);
  }
  if (pCover->pLits != (int *)0x0) {
    for (lVar1 = 0; lVar1 < pCover->nBits; lVar1 = lVar1 + 1) {
      printf(" %d",(ulong)(uint)pCover->pLits[lVar1]);
    }
    putchar(10);
  }
  puts("End of cover printout");
  return;
}

Assistant:

void Mvc_CoverPrint( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int i;
    // print general statistics
    printf( "The cover contains %d cubes (%d bits and %d words)\n", 
        pCover->lCubes.nItems, pCover->nBits, pCover->nWords );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubePrint( pCover, pCube );

    if ( pCover->pLits )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            printf( " %d", pCover->pLits[i] );
        printf( "\n" ); 
    }
    printf( "End of cover printout\n" ); 
}